

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.cpp
# Opt level: O2

int64_t xmrig::Json::getInt64(Value *obj,char *key,int64_t defaultValue)

{
  ConstMemberIterator CVar1;
  
  CVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::FindMember(obj,key);
  if ((CVar1.ptr_ !=
       (Pointer)((ulong)(obj->data_).s.length * 0x20 + ((ulong)(obj->data_).s.str & 0xffffffffffff))
      ) && ((undefined1  [16])
            ((undefined1  [16])((CVar1.ptr_)->value).data_ & (undefined1  [16])0x80000000000000) !=
            (undefined1  [16])0x0)) {
    defaultValue = *(int64_t *)&((CVar1.ptr_)->value).data_.n;
  }
  return defaultValue;
}

Assistant:

int64_t xmrig::Json::getInt64(const rapidjson::Value &obj, const char *key, int64_t defaultValue)
{
    assert(obj.IsObject());

    auto i = obj.FindMember(key);
    if (i != obj.MemberEnd() && i->value.IsInt64()) {
        return i->value.GetInt64();
    }

    return defaultValue;
}